

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

Node * FindNode(Node *root,string *name)

{
  size_t __n;
  pointer ppNVar1;
  int iVar2;
  pointer ppNVar3;
  
  __n = (root->mName)._M_string_length;
  if ((__n != name->_M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((root->mName)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar2 != 0)))) {
    ppNVar3 = (root->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppNVar1 = (root->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while ((root = (Node *)0x0, ppNVar3 != ppNVar1 &&
           (root = FindNode(*ppNVar3,name), root == (Node *)0x0))) {
      ppNVar3 = ppNVar3 + 1;
    }
  }
  return root;
}

Assistant:

D3DS::Node* FindNode(D3DS::Node* root, const std::string& name)
{
    if (root->mName == name)
        return root;
    for (std::vector<D3DS::Node*>::iterator it = root->mChildren.begin();it != root->mChildren.end(); ++it) {
        D3DS::Node* nd;
        if (( nd = FindNode(*it,name)))
            return nd;
    }
    return NULL;
}